

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManStop(Iso_Man_t *p,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  int level;
  Iso_Man_t *pIVar2;
  double dVar3;
  double dVar4;
  
  if (fVerbose != 0) {
    p->timeOther = p->timeTotal - (p->timeHash + p->timeFout);
    pIVar2 = p;
    Abc_Print((int)p,"%s =","Building ");
    level = (int)pIVar2;
    dVar3 = 0.0;
    if (p->timeTotal != 0) {
      dVar3 = ((double)p->timeFout * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeFout / 1000000.0,dVar3);
    Abc_Print(level,"%s =","Hashing  ");
    dVar4 = (double)(p->timeHash - p->timeSort);
    dVar3 = 0.0;
    if (p->timeTotal != 0) {
      dVar3 = (dVar4 * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar4 / 1000000.0,dVar3);
    Abc_Print(level,"%s =","Sorting  ");
    dVar3 = 0.0;
    if (p->timeTotal != 0) {
      dVar3 = ((double)p->timeSort * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSort / 1000000.0,dVar3);
    Abc_Print(level,"%s =","Other    ");
    dVar3 = 0.0;
    if (p->timeTotal != 0) {
      dVar3 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar3);
    Abc_Print(level,"%s =","TOTAL    ");
    dVar3 = (double)p->timeTotal;
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = (dVar3 * 100.0) / dVar3;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar3 / 1000000.0,dVar4);
  }
  pVVar1 = p->vTemp1;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTemp2;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vClasses;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vSingles;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p->pBins != (int *)0x0) {
    free(p->pBins);
    p->pBins = (int *)0x0;
  }
  if (p->pObjs != (Iso_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Iso_Obj_t *)0x0;
  }
  if (p != (Iso_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Iso_ManStop( Iso_Man_t * p, int fVerbose )
{
    if ( fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeHash - p->timeFout;
        ABC_PRTP( "Building ", p->timeFout,               p->timeTotal );
        ABC_PRTP( "Hashing  ", p->timeHash-p->timeSort,   p->timeTotal );
        ABC_PRTP( "Sorting  ", p->timeSort,               p->timeTotal );
        ABC_PRTP( "Other    ", p->timeOther,              p->timeTotal );
        ABC_PRTP( "TOTAL    ", p->timeTotal,              p->timeTotal );
    }
    Vec_PtrFree( p->vTemp1 );
    Vec_PtrFree( p->vTemp2 );
    Vec_PtrFree( p->vClasses );
    Vec_PtrFree( p->vSingles );
    ABC_FREE( p->pBins );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}